

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManPrintClasses_old(Gia_Man_t *p)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  if (p->vFlopClasses == (Vec_Int_t *)0x0) {
    return;
  }
  uVar4 = (ulong)(uint)p->nRegs;
  pGVar2 = p;
  if (0 < p->nRegs) {
    lVar5 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar4 = (ulong)(uint)(iVar1 - (int)uVar4) + lVar5;
      iVar3 = (int)uVar4;
      if ((iVar3 < 0) || (iVar1 <= iVar3)) {
LAB_00218f55:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCis->pArray[uVar4 & 0xffffffff];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->vFlopClasses->nSize <= lVar5) goto LAB_00218f55;
      Abc_Print((int)pGVar2,"%d",(ulong)(uint)p->vFlopClasses->pArray[lVar5]);
      lVar5 = lVar5 + 1;
      uVar4 = (ulong)p->nRegs;
    } while (lVar5 < (long)uVar4);
  }
  Abc_Print((int)pGVar2,"\n");
  pGVar2 = Gia_ManDupFlopClass(p,1);
  Gia_AigerWrite(pGVar2,"dom1.aig",0,0,0);
  Gia_ManStop(pGVar2);
  pGVar2 = Gia_ManDupFlopClass(p,2);
  Gia_AigerWrite(pGVar2,"dom2.aig",0,0,0);
  Gia_ManStop(pGVar2);
  return;
}

Assistant:

void Gia_ManPrintClasses_old( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->vFlopClasses == NULL )
        return;
    Gia_ManForEachRo( p, pObj, i )
        Abc_Print( 1, "%d", Vec_IntEntry(p->vFlopClasses, i) );
    Abc_Print( 1, "\n" );

    {
        Gia_Man_t * pTemp;
        pTemp = Gia_ManDupFlopClass( p, 1 );
        Gia_AigerWrite( pTemp, "dom1.aig", 0, 0, 0 );
        Gia_ManStop( pTemp );
        pTemp = Gia_ManDupFlopClass( p, 2 );
        Gia_AigerWrite( pTemp, "dom2.aig", 0, 0, 0 );
        Gia_ManStop( pTemp );
    }
}